

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O2

void __thiscall
MinVR::VRError::VRError
          (VRError *this,string *whatMsg,string *adviceMsg,string *whereFile,int *whereLine,
          string *whereFunc)

{
  ostream *poVar1;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  *(undefined ***)this = &PTR__VRError_001241b0;
  std::__cxx11::string::string((string *)&this->_whatMsg,(string *)whatMsg);
  std::__cxx11::string::string((string *)&this->_adviceMsg,(string *)adviceMsg);
  std::__cxx11::string::string((string *)&this->_whereFile,(string *)whereFile);
  std::__cxx11::string::string((string *)&this->_whereFunc,(string *)whereFunc);
  (this->_whereLine)._M_dataplus._M_p = (pointer)&(this->_whereLine).field_2;
  (this->_whereLine)._M_string_length = 0;
  (this->_whereLine).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::operator<<(local_1a8,*whereLine);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_whereLine,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  _errorMessage_abi_cxx11_(&local_1d8,this);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&local_1d8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

VRError(const std::string& whatMsg,
         const std::string& adviceMsg = "",
         const std::string& whereFile = "",
         const int& whereLine = 0,
         const std::string& whereFunc = ""):
  _whatMsg(whatMsg), _adviceMsg(adviceMsg),
    _whereFile(whereFile), _whereFunc(whereFunc) {

    // Convert the line number to a string.
    std::stringstream ss; ss << whereLine; _whereLine = ss.str();
	std::cerr << _errorMessage() << std::endl;
  }